

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicList::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,uint index)

{
  StructBuilder other;
  long *plVar1;
  undefined8 uVar2;
  ElementSize EVar3;
  Which WVar4;
  Orphan<capnp::DynamicValue> *pOVar5;
  Schema SVar6;
  StructSchema schema;
  ListBuilder inner;
  Orphan<capnp::DynamicStruct> result;
  StructBuilder element;
  undefined1 local_148 [8];
  anon_union_56_12_1c583c3a_for_Builder_1 aStack_140;
  BuilderArena *local_108;
  anon_union_56_12_1c583c3a_for_Builder_1 aStack_100;
  Orphan<capnp::DynamicStruct> local_c0;
  Builder local_98;
  StructBuilder local_58;
  
  WVar4 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar4 = (this->schema).elementType.baseType;
  }
  if (WVar4 < (ANY_POINTER|BOOL)) {
    if ((0x8fffU >> (WVar4 & 0x1f) & 1) != 0) {
      operator[](&local_98,this,index);
      switch(local_98.type) {
      case BOOL:
        break;
      case INT:
      case UINT:
      case FLOAT:
      case STRUCT:
        break;
      case LIST:
        break;
      case ENUM:
        break;
      case CAPABILITY:
        plVar1 = (long *)CONCAT62(local_98.field_1.dataValue.super_ArrayPtr<unsigned_char>.size_.
                                  _2_6_,local_98.field_1.enumValue.value);
        if (plVar1 != (long *)0x0) {
          (*(code *)(((local_98.field_1.anyPointerValue.builder.segment)->super_SegmentReader).arena
                    )->_vptr_Arena)
                    (local_98.field_1.intValue,(long)plVar1 + *(long *)(*plVar1 + -0x10));
        }
      }
      WVar4 = LIST;
      if ((this->schema).elementType.listDepth == '\0') {
        WVar4 = (this->schema).elementType.baseType;
      }
      EVar3 = anon_unknown_71::elementSizeFor(WVar4);
      pOVar5 = (Orphan<capnp::DynamicValue> *)
               (*(code *)(&DAT_0022a988 + *(int *)(&DAT_0022a988 + (ulong)EVar3 * 4)))();
      return pOVar5;
    }
    if ((0x67000U >> (WVar4 & 0x1f) & 1) == 0) {
      aStack_140.listValue.builder.capTable =
           (CapTableBuilder *)*(undefined8 *)&(this->builder).structDataSize;
      local_148 = (undefined1  [8])(this->builder).segment;
      aStack_140.intValue = (int64_t)(this->builder).capTable;
      aStack_140.textValue.content.ptr = (char *)(this->builder).ptr;
      aStack_140._16_4_ = (this->builder).elementCount;
      aStack_140._20_4_ = (this->builder).step;
      SVar6.raw = (RawBrandedSchema *)_::ListBuilder::getArena((ListBuilder *)local_148);
      aStack_140.anyPointerValue.builder.segment =
           (SegmentBuilder *)_::ListBuilder::getCapTable((ListBuilder *)local_148);
      local_148 = (undefined1  [8])SVar6.raw;
      schema = Type::asStruct((Type *)this);
      Orphanage::newOrphan(&local_c0,(Orphanage *)local_148,schema);
      _::ListBuilder::getStructElement(&local_58,&this->builder,index);
      Orphan<capnp::DynamicStruct>::get((Builder *)local_148,&local_c0);
      other.capTable = local_58.capTable;
      other.segment = local_58.segment;
      other.data = local_58.data;
      other.pointers = local_58.pointers;
      other.dataSize = local_58.dataSize;
      other.pointerCount = local_58.pointerCount;
      other._38_2_ = local_58._38_2_;
      _::StructBuilder::transferContentFrom((StructBuilder *)&aStack_140.textValue,other);
      _::StructBuilder::clearAll(&local_58);
      Orphan<capnp::DynamicStruct>::get(&aStack_140.structValue,&local_c0);
      local_148._0_4_ = STRUCT;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_148,&local_c0.builder);
      if (local_c0.builder.segment != (SegmentBuilder *)0x0) {
        _::OrphanBuilder::euthanize(&local_c0.builder);
      }
    }
    else {
      operator[]((Builder *)local_148,this,index);
      if (local_148._0_4_ == CAPABILITY) {
        local_108 = (BuilderArena *)CONCAT44(local_108._4_4_,CAPABILITY);
        (*(code *)((aStack_140.structValue.builder.segment)->super_SegmentReader).arena[4].
                  _vptr_Arena)();
        aStack_100.textValue.content.size_ = aStack_140.textValue.content.size_;
      }
      else {
        aStack_100._40_8_ = aStack_140._40_8_;
        aStack_100._48_8_ = aStack_140._48_8_;
        aStack_100.listValue.builder.capTable = aStack_140.listValue.builder.capTable;
        aStack_100.listValue.builder.ptr = aStack_140.listValue.builder.ptr;
        aStack_100.structValue.builder.segment = aStack_140.structValue.builder.segment;
        aStack_100.textValue.content.size_ = aStack_140.textValue.content.size_;
        local_108 = (BuilderArena *)local_148;
        aStack_100.intValue = aStack_140.intValue;
      }
      local_58.data = (this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3);
      local_58.segment = (this->builder).segment;
      local_58.capTable = (this->builder).capTable;
      _::PointerBuilder::disown((OrphanBuilder *)&local_c0,(PointerBuilder *)&local_58);
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)&local_108,(OrphanBuilder *)&local_c0);
      if (local_c0.builder.tag.content != 0) {
        _::OrphanBuilder::euthanize((OrphanBuilder *)&local_c0);
      }
      uVar2 = aStack_100.textValue.content.ptr;
      if (((Type)local_108 == CAPABILITY) && (aStack_100._8_8_ != (SegmentBuilder *)0x0)) {
        aStack_100.textValue.content.ptr = (char *)0x0;
        (*(code *)(((aStack_100.anyPointerValue.builder.segment)->super_SegmentReader).arena)->
                  _vptr_Arena)
                  (aStack_100.intValue,
                   (char *)(uVar2 + (long)(((SegmentBuilder *)uVar2)->super_SegmentReader).arena[-2]
                                          ._vptr_Arena));
      }
      if ((local_148._0_4_ == CAPABILITY) && (aStack_140._8_8_ != (SegmentBuilder *)0x0)) {
        (*(code *)(((aStack_140.anyPointerValue.builder.segment)->super_SegmentReader).arena)->
                  _vptr_Arena)
                  (aStack_140.intValue,
                   aStack_140.textValue.content.ptr +
                   (long)((aStack_140.structValue.builder.segment)->super_SegmentReader).arena[-2].
                         _vptr_Arena);
      }
    }
    return __return_storage_ptr__;
  }
  kj::_::unreachable();
}

Assistant:

Orphan<DynamicValue> DynamicList::Builder::disown(uint index) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM: {
      auto result = Orphan<DynamicValue>(operator[](index), _::OrphanBuilder());
      switch (elementSizeFor(schema.whichElementType())) {
        case ElementSize::VOID: break;
        case ElementSize::BIT: builder.setDataElement<bool>(bounded(index) * ELEMENTS, false); break;
        case ElementSize::BYTE: builder.setDataElement<uint8_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::TWO_BYTES: builder.setDataElement<uint16_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::FOUR_BYTES: builder.setDataElement<uint32_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::EIGHT_BYTES: builder.setDataElement<uint64_t>(bounded(index) * ELEMENTS, 0);break;

        case ElementSize::POINTER:
        case ElementSize::INLINE_COMPOSITE:
          KJ_UNREACHABLE;
      }
      return kj::mv(result);
    }

    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::LIST:
    case schema::Type::ANY_POINTER:
    case schema::Type::INTERFACE: {
      auto value = operator[](index);
      return Orphan<DynamicValue>(value, builder.getPointerElement(bounded(index) * ELEMENTS).disown());
    }

    case schema::Type::STRUCT: {
      // We have to make a copy.
      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(schema.getStructElementType());
      auto element = builder.getStructElement(bounded(index) * ELEMENTS);
      result.get().builder.transferContentFrom(element);
      element.clearAll();
      return kj::mv(result);
    }
  }
  KJ_UNREACHABLE;
}